

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_bias_or_compare
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  string shaderSource_09;
  string shaderSource_10;
  string shaderSource_11;
  string shaderSource_12;
  string shaderSource_13;
  string shaderSource_14;
  string shaderSource_15;
  string shaderSource_16;
  string shaderSource_17;
  string shaderSource_18;
  string shaderSource_19;
  string shaderSource_20;
  string shaderSource_21;
  string shaderSource_22;
  string shaderSource_23;
  string shaderSource_24;
  string shaderSource_25;
  string shaderSource_26;
  string shaderSource_27;
  string shaderSource_28;
  string shaderSource_29;
  string shaderSource_30;
  string shaderSource_31;
  string shaderSource_32;
  string shaderSource_33;
  string shaderSource_34;
  string shaderSource_35;
  string shaderSource_36;
  string shaderSource_37;
  string shaderSource_38;
  string shaderSource_39;
  string shaderSource_40;
  string shaderSource_41;
  string shaderSource_42;
  string shaderSource_43;
  string shaderSource_44;
  string shaderSource_45;
  string shaderSource_46;
  string shaderSource_47;
  string shaderSource_48;
  string shaderSource_49;
  string shaderSource_50;
  string shaderSource_51;
  string shaderSource_52;
  string shaderSource_53;
  bool bVar1;
  ContextType CVar2;
  char *__s;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  DataType dataType;
  DataType dataType_00;
  long lVar5;
  string shaderSource;
  DataType DVar6;
  DataType DVar7;
  DataType DVar8;
  DataType DVar9;
  undefined4 in_stack_fffffffffffff86c;
  DataType in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  _Alloc_hider _Var10;
  size_type sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  long local_768;
  allocator<char> local_759;
  string local_758;
  long *local_738 [2];
  long local_728 [2];
  long *local_718 [2];
  long local_708 [2];
  long *local_6f8 [2];
  long local_6e8 [2];
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long local_78;
  string local_70;
  string local_50;
  
  _Var10._M_p = (pointer)&local_778;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff878,"texture: Invalid bias/compare type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_778) {
    operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
  }
  lVar5 = 0;
  do {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar5];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      local_78 = lVar5;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,__s,&local_759);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,0x99df33);
      _Var10._M_p = (pointer)&local_778;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar4) {
        local_778._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_778._8_8_ = plVar3[3];
      }
      else {
        local_778._M_allocated_capacity = paVar4->_M_allocated_capacity;
        _Var10._M_p = (pointer)*plVar3;
      }
      sVar11 = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff878);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != &local_778) {
        operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_758._M_dataplus._M_p != &local_758.field_2) {
        operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
      }
      lVar5 = 0;
      do {
        if (lVar5 != 0) {
          DVar7 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          DVar6 = DVar7;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,
                     TYPE_FLOAT_VEC2,DVar7,in_stack_fffffffffffff870);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_00._M_dataplus._M_p._0_4_ = DVar6;
          shaderSource_00._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_00._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_00.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_98[0],shaderSource_00);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar6 = DVar7;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,
                     TYPE_FLOAT_VEC2,DVar7,in_stack_fffffffffffff870);
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_01._M_dataplus._M_p._0_4_ = DVar6;
          shaderSource_01._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_01._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_01.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_b8[0],shaderSource_01);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,
                     TYPE_FLOAT_VEC2,DVar7,in_stack_fffffffffffff870);
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_02._M_dataplus._M_p._0_4_ = DVar7;
          shaderSource_02._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_02._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_02.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_02.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d8[0],shaderSource_02);
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar7 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar5);
        DVar6 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,TYPE_FLOAT_VEC2
                   ,DVar7,in_stack_fffffffffffff870);
        local_f8[0] = local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_03._M_dataplus._M_p._0_4_ = DVar6;
        shaderSource_03._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_03._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_03.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_03.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_f8[0],shaderSource_03);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar6 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar5);
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,TYPE_FLOAT_VEC2
                   ,DVar6,in_stack_fffffffffffff870);
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_04._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_04._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_04._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_04.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_04.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_118[0],shaderSource_04);
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,TYPE_FLOAT_VEC2
                   ,DVar7,in_stack_fffffffffffff870);
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_05._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_05._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_05._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_05.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_05.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_138[0],shaderSource_05);
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,DVar6,in_stack_fffffffffffff870);
        local_158[0] = local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_158,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_06._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_06._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_06._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_06.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_06.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_158[0],shaderSource_06);
        if (local_158[0] != local_148) {
          operator_delete(local_158[0],local_148[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,DVar7,in_stack_fffffffffffff870);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_178,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_07._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_07._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_07._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_07.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_07.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_178[0],shaderSource_07);
        if (local_178[0] != local_168) {
          operator_delete(local_178[0],local_168[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,TYPE_FLOAT_VEC2
                   ,DVar6,in_stack_fffffffffffff870);
        local_198[0] = local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_08._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_08._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_08._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_08.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_08.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_198[0],shaderSource_08);
        if (local_198[0] != local_188) {
          operator_delete(local_198[0],local_188[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        local_768 = lVar5;
        if (lVar5 != 0) {
          DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_1b8[0] = local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_09._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_09._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_09._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_09._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_09.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_09.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_1b8[0],shaderSource_09);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_1d8[0] = local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_10._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_10._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_10._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_10._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_10.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_10.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_1d8[0],shaderSource_10);
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0],local_1c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_1f8[0] = local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_11._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_11._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_11._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_11._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_11.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_11.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_1f8[0],shaderSource_11);
          if (local_1f8[0] != local_1e8) {
            operator_delete(local_1f8[0],local_1e8[0] + 1);
          }
          lVar5 = local_768;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_12._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_12._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_12._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_12._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_12.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_12.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_218[0],shaderSource_12);
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_238[0] = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_13._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_13._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_13._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_13._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_13.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_13.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_238[0],shaderSource_13);
        if (local_238[0] != local_228) {
          operator_delete(local_238[0],local_228[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_14._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_14._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_14._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_14._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_14.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_14.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_258[0],shaderSource_14);
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_278[0] = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_15._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_15._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_15._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_15._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_15.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_15.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_278[0],shaderSource_15);
        if (local_278[0] != local_268) {
          operator_delete(local_278[0],local_268[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_16._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_16._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_16._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_16._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_16.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_16.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_298[0],shaderSource_16);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0],local_288[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_17._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_17._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_17._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_17._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_17.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_17.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2b8[0],shaderSource_17);
        if (local_2b8[0] != local_2a8) {
          operator_delete(local_2b8[0],local_2a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        if (lVar5 != 0) {
          DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_2d8[0] = local_2c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_18._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_18._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_18._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_18._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_18.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_18.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_2d8[0],shaderSource_18);
          if (local_2d8[0] != local_2c8) {
            operator_delete(local_2d8[0],local_2c8[0] + 1);
          }
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_758,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffff878,(string *)&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          local_2f8[0] = local_2e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_19._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_19._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_19._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_19._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_19.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_19.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_2f8[0],shaderSource_19);
          if (local_2f8[0] != local_2e8) {
            operator_delete(local_2f8[0],local_2e8[0] + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_758,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffff878,(string *)&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_318,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_20._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_20._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_20._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_20._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_20.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_20.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_318[0],shaderSource_20);
          if (local_318[0] != local_308) {
            operator_delete(local_318[0],local_308[0] + 1);
          }
          lVar5 = local_768;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_338[0] = local_328;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_21._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_21._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_21._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_21._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_21.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_21.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_338[0],shaderSource_21);
        if (local_338[0] != local_328) {
          operator_delete(local_338[0],local_328[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_358[0] = local_348;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_358,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_22._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_22._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_22._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_22._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_22.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_22.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_358[0],shaderSource_22);
        if (local_358[0] != local_348) {
          operator_delete(local_358[0],local_348[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_378,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_23._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_23._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_23._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_23._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_23.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_23.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_378[0],shaderSource_23);
        if (local_378[0] != local_368) {
          operator_delete(local_378[0],local_368[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_398[0] = local_388;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_398,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_24._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_24._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_24._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_24._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_24.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_24.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_398[0],shaderSource_24);
        if (local_398[0] != local_388) {
          operator_delete(local_398[0],local_388[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_25._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_25._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_25._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_25._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_25.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_25.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3b8[0],shaderSource_25);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_3d8[0] = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_26._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_26._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_26._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_26._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_26.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_26.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3d8[0],shaderSource_26);
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        if (lVar5 != 0) {
          DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_3f8[0] = local_3e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3f8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_27._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_27._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_27._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_27._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_27.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_27.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_3f8[0],shaderSource_27);
          if (local_3f8[0] != local_3e8) {
            operator_delete(local_3f8[0],local_3e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar9 = DVar8;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_418[0] = local_408;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_418,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_28._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_28._M_dataplus._M_p._0_4_ = DVar9;
          shaderSource_28._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_28._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_28.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_28.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_418[0],shaderSource_28);
          if (local_418[0] != local_408) {
            operator_delete(local_418[0],local_408[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_438[0] = local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_29._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_29._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_29._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_29._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_29.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_29.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_438[0],shaderSource_29);
          if (local_438[0] != local_428) {
            operator_delete(local_438[0],local_428[0] + 1);
          }
          lVar5 = local_768;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_458[0] = local_448;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_458,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_30._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_30._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_30._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_30._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_30.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_30.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_458[0],shaderSource_30);
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_478[0] = local_468;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_478,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_31._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_31._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_31._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_31._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_31.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_31.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_478[0],shaderSource_31);
        if (local_478[0] != local_468) {
          operator_delete(local_478[0],local_468[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_498[0] = local_488;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_498,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_32._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_32._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_32._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_32._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_32.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_32.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_498[0],shaderSource_32);
        if (local_498[0] != local_488) {
          operator_delete(local_498[0],local_488[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_4b8[0] = local_4a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4b8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_33._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_33._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_33._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_33._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_33.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_33.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4b8[0],shaderSource_33);
        if (local_4b8[0] != local_4a8) {
          operator_delete(local_4b8[0],local_4a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_4d8[0] = local_4c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_34._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_34._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_34._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_34._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_34.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_34.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4d8[0],shaderSource_34);
        if (local_4d8[0] != local_4c8) {
          operator_delete(local_4d8[0],local_4c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_4f8[0] = local_4e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_35._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_35._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_35._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_35._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_35.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_35.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4f8[0],shaderSource_35);
        if (local_4f8[0] != local_4e8) {
          operator_delete(local_4f8[0],local_4e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        if (lVar5 != 0) {
          DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,
                     TYPE_FLOAT_VEC3,DVar8,in_stack_fffffffffffff870);
          local_518[0] = local_508;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_518,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_36._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_36._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_36._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_36._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_36.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_36.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_518[0],shaderSource_36);
          if (local_518[0] != local_508) {
            operator_delete(local_518[0],local_508[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC3
                   ,DVar7,in_stack_fffffffffffff870);
        local_538[0] = local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_37._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_37._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_37._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_37._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_37.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_37.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_538[0],shaderSource_37);
        if (local_538[0] != local_528) {
          operator_delete(local_538[0],local_528[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,TYPE_FLOAT_VEC3
                   ,DVar6,in_stack_fffffffffffff870);
        local_558[0] = local_548;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_38._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_38._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_38._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_38._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_38.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_38.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_558[0],shaderSource_38);
        if (local_558[0] != local_548) {
          operator_delete(local_558[0],local_548[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        if (lVar5 != 0) {
          DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,
                     TYPE_FLOAT_VEC4,DVar8,in_stack_fffffffffffff870);
          local_578[0] = local_568;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_578,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_39._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_39._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_39._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_39._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_39.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_39.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_578[0],shaderSource_39);
          if (local_578[0] != local_568) {
            operator_delete(local_578[0],local_568[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        DVar8 = DVar7;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,TYPE_FLOAT_VEC4
                   ,DVar7,in_stack_fffffffffffff870);
        local_598[0] = local_588;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_598,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_40._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_40._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_40._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_40._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_40.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_40.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_598[0],shaderSource_40);
        if (local_598[0] != local_588) {
          operator_delete(local_598[0],local_588[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        DVar8 = DVar6;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,TYPE_FLOAT_VEC4
                   ,DVar6,in_stack_fffffffffffff870);
        local_5b8[0] = local_5a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b8,_Var10._M_p,_Var10._M_p + sVar11);
        shaderSource_41._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
        shaderSource_41._M_dataplus._M_p._0_4_ = DVar8;
        shaderSource_41._M_string_length._0_4_ = in_stack_fffffffffffff870;
        shaderSource_41._M_string_length._4_4_ = in_stack_fffffffffffff874;
        shaderSource_41.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
        shaderSource_41.field_2._8_8_ = sVar11;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_5b8[0],shaderSource_41);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0],local_5a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_778) {
          operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
        }
        CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
        if (bVar1) {
LAB_005cdf3d:
          if (lVar5 != 0) {
            DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
            DVar9 = DVar8;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                       TYPE_FLOAT_VEC4,DVar8,in_stack_fffffffffffff870);
            local_5d8[0] = local_5c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5d8,_Var10._M_p,_Var10._M_p + sVar11);
            shaderSource_42._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
            shaderSource_42._M_dataplus._M_p._0_4_ = DVar9;
            shaderSource_42._M_string_length._0_4_ = in_stack_fffffffffffff870;
            shaderSource_42._M_string_length._4_4_ = in_stack_fffffffffffff874;
            shaderSource_42.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
            shaderSource_42.field_2._8_8_ = sVar11;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_5d8[0],shaderSource_42);
            if (local_5d8[0] != local_5c8) {
              operator_delete(local_5d8[0],local_5c8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_778) {
              operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
            }
            DVar9 = DVar8;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                       TYPE_FLOAT_VEC4,DVar8,in_stack_fffffffffffff870);
            local_5f8[0] = local_5e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5f8,_Var10._M_p,_Var10._M_p + sVar11);
            shaderSource_43._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
            shaderSource_43._M_dataplus._M_p._0_4_ = DVar9;
            shaderSource_43._M_string_length._0_4_ = in_stack_fffffffffffff870;
            shaderSource_43._M_string_length._4_4_ = in_stack_fffffffffffff874;
            shaderSource_43.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
            shaderSource_43.field_2._8_8_ = sVar11;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_5f8[0],shaderSource_43);
            if (local_5f8[0] != local_5e8) {
              operator_delete(local_5f8[0],local_5e8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_778) {
              operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                       TYPE_FLOAT_VEC4,DVar8,in_stack_fffffffffffff870);
            local_618[0] = local_608;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_618,_Var10._M_p,_Var10._M_p + sVar11);
            shaderSource_44._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
            shaderSource_44._M_dataplus._M_p._0_4_ = DVar8;
            shaderSource_44._M_string_length._0_4_ = in_stack_fffffffffffff870;
            shaderSource_44._M_string_length._4_4_ = in_stack_fffffffffffff874;
            shaderSource_44.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
            shaderSource_44.field_2._8_8_ = sVar11;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_618[0],shaderSource_44);
            if (local_618[0] != local_608) {
              operator_delete(local_618[0],local_608[0] + 1);
            }
            lVar5 = local_768;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_778) {
              operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
            }
          }
          DVar8 = DVar7;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                     TYPE_FLOAT_VEC4,DVar7,in_stack_fffffffffffff870);
          local_638[0] = local_628;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_638,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_45._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_45._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_45._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_45._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_45.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_45.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_638[0],shaderSource_45);
          if (local_638[0] != local_628) {
            operator_delete(local_638[0],local_628[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar8 = DVar6;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                     TYPE_FLOAT_VEC4,DVar6,in_stack_fffffffffffff870);
          local_658[0] = local_648;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_658,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_46._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_46._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_46._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_46._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_46.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_46.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_658[0],shaderSource_46);
          if (local_658[0] != local_648) {
            operator_delete(local_658[0],local_648[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar8 = DVar7;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                     TYPE_FLOAT_VEC4,DVar7,in_stack_fffffffffffff870);
          local_678[0] = local_668;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_47._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_47._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_47._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_47._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_47.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_47.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_678[0],shaderSource_47);
          if (local_678[0] != local_668) {
            operator_delete(local_678[0],local_668[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar8 = DVar6;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                     TYPE_FLOAT_VEC4,DVar6,in_stack_fffffffffffff870);
          local_698[0] = local_688;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_698,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_48._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_48._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_48._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_48._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_48.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_48.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_698[0],shaderSource_48);
          if (local_698[0] != local_688) {
            operator_delete(local_698[0],local_688[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar8 = DVar7;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                     TYPE_FLOAT_VEC4,DVar7,in_stack_fffffffffffff870);
          local_6b8[0] = local_6a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6b8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_49._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_49._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_49._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_49._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_49.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_49.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_6b8[0],shaderSource_49);
          if (local_6b8[0] != local_6a8) {
            operator_delete(local_6b8[0],local_6a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          DVar8 = DVar6;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                     TYPE_FLOAT_VEC4,DVar6,in_stack_fffffffffffff870);
          local_6d8[0] = local_6c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6d8,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_50._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_50._M_dataplus._M_p._0_4_ = DVar8;
          shaderSource_50._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_50._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_50.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_50.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_6d8[0],shaderSource_50);
          if (local_6d8[0] != local_6c8) {
            operator_delete(local_6d8[0],local_6c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        else {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          lVar5 = local_768;
          if (bVar1) goto LAB_005cdf3d;
        }
        CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
        if (bVar1) {
LAB_005ce5b7:
          if (lVar5 != 0) {
            DVar8 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar5);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                       TYPE_FLOAT_VEC4,DVar8,in_stack_fffffffffffff870);
            local_6f8[0] = local_6e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6f8,_Var10._M_p,_Var10._M_p + sVar11);
            shaderSource_51._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
            shaderSource_51._M_dataplus._M_p._0_4_ = DVar8;
            shaderSource_51._M_string_length._0_4_ = in_stack_fffffffffffff870;
            shaderSource_51._M_string_length._4_4_ = in_stack_fffffffffffff874;
            shaderSource_51.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
            shaderSource_51.field_2._8_8_ = sVar11;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_6f8[0],shaderSource_51);
            if (local_6f8[0] != local_6e8) {
              operator_delete(local_6f8[0],local_6e8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_778) {
              operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
            }
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                     TYPE_FLOAT_VEC4,DVar7,in_stack_fffffffffffff870);
          local_718[0] = local_708;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_718,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_52._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_52._M_dataplus._M_p._0_4_ = DVar7;
          shaderSource_52._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_52._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_52.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_52.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_718[0],shaderSource_52);
          if (local_718[0] != local_708) {
            operator_delete(local_718[0],local_708[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff878,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                     TYPE_FLOAT_VEC4,DVar6,in_stack_fffffffffffff870);
          local_738[0] = local_728;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_738,_Var10._M_p,_Var10._M_p + sVar11);
          shaderSource_53._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff86c;
          shaderSource_53._M_dataplus._M_p._0_4_ = DVar6;
          shaderSource_53._M_string_length._0_4_ = in_stack_fffffffffffff870;
          shaderSource_53._M_string_length._4_4_ = in_stack_fffffffffffff874;
          shaderSource_53.field_2._M_allocated_capacity = (size_type)_Var10._M_p;
          shaderSource_53.field_2._8_8_ = sVar11;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_738[0],shaderSource_53);
          if (local_738[0] != local_728) {
            operator_delete(local_738[0],local_728[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_778) {
            operator_delete(_Var10._M_p,local_778._M_allocated_capacity + 1);
          }
        }
        else {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_70,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          lVar5 = local_768;
          if (bVar1) goto LAB_005ce5b7;
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar5 = local_78;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void texture_invalid_bias_or_compare (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid bias/compare type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}